

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

int __thiscall doctest::Context::run(Context *this)

{
  int *piVar1;
  char cVar2;
  uint uVar3;
  uint uVar4;
  pointer pvVar5;
  const_iterator __position;
  pointer ppIVar6;
  TestCase *pTVar7;
  vector<doctest::String,_std::allocator<doctest::String>_> *filters;
  char *name;
  char *name_00;
  pointer ppTVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  ContextState *pCVar18;
  size_type sVar19;
  ticks_t tVar20;
  byte bVar21;
  uint uVar22;
  code *__comp;
  IReporter **curr_rep_1;
  long lVar23;
  pointer ppIVar24;
  ulong *name_01;
  ContextState *pCVar25;
  ContextState *pCVar26;
  pointer ppTVar27;
  IReporter **curr_rep;
  ulong uVar28;
  _Ios_Openmode _Var29;
  TestCase *name_02;
  undefined1 *puVar30;
  long in_FS_OFFSET;
  vector<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_> queryResults
  ;
  vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  testArray;
  ContextState *old_cs;
  anon_class_24_3_e7807fc8 cleanup_and_return;
  undefined1 local_328 [136];
  char local_2a0 [24];
  stack_t sigStack;
  set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  testSuitesPassingFilt;
  fstream fstr;
  ostream local_230 [512];
  
  old_cs = detail::g_cs;
  pCVar26 = this->p;
  is_running_in_test = 1;
  detail::g_cs = pCVar26;
  *(bool *)(in_FS_OFFSET + -0x38) = (pCVar26->super_ContextOptions).no_colors;
  (pCVar26->super_CurrentTestCaseStats).numAssertsCurrentTest = 0;
  (pCVar26->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = 0;
  *(undefined8 *)&(pCVar26->super_ContextOptions).field_0x8c = 0;
  *(undefined8 *)&pCVar26->field_0x94 = 0;
  *(undefined8 *)&pCVar26->field_0x9c = 0;
  pCVar26 = this->p;
  (pCVar26->super_ContextOptions).cout = (ostream *)&std::cout;
  (pCVar26->super_ContextOptions).cerr = (ostream *)&std::cerr;
  std::fstream::fstream(&fstr);
  pCVar26 = this->p;
  bVar21 = (pCVar26->super_ContextOptions).out.field_0.buf[0x17];
  if ((char)bVar21 < '\0') {
    uVar22 = (pCVar26->super_ContextOptions).out.field_0.data.size;
  }
  else {
    uVar22 = 0x17 - (bVar21 & 0x1f);
  }
  if (uVar22 != 0) {
    if ((char)bVar21 < '\0') {
      _Var29 = (_Ios_Openmode)*(undefined8 *)&(pCVar26->super_ContextOptions).out.field_0;
    }
    else {
      _Var29 = (int)pCVar26 + (_S_trunc|_S_out);
    }
    std::fstream::open((char *)&fstr,_Var29);
    pCVar26 = this->p;
    (pCVar26->super_ContextOptions).cout = local_230;
  }
  pCVar25 = (anonymous_namespace)::FatalConditionHandler::altStackSize;
  (anonymous_namespace)::FatalConditionHandler::altStackMem =
       operator_new__((ulong)(anonymous_namespace)::FatalConditionHandler::altStackSize);
  cleanup_and_return.old_cs = &old_cs;
  pvVar5 = (pCVar26->filters).
           super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  cleanup_and_return.fstr = &fstr;
  cleanup_and_return.this = this;
  if (pvVar5[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_start ==
      pvVar5[8].super__Vector_base<doctest::String,_std::allocator<doctest::String>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    String::String((String *)local_328,"console");
    std::vector<doctest::String,_std::allocator<doctest::String>_>::emplace_back<doctest::String>
              (pvVar5 + 8,(String *)local_328);
    pCVar25 = (ContextState *)local_328;
    String::~String((String *)pCVar25);
  }
  anon_unknown_14::getReporters();
  pCVar26 = (ContextState *)
            anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left
  ;
  while (pCVar26 !=
         (ContextState *)&anon_unknown_14::getReporters::data._M_t._M_impl.super__Rb_tree_header) {
    if ((char)*(undefined1 *)((long)&pCVar26->super_ContextOptions + 0x3f) < '\0') {
      name_01 = (ulong *)((_union_1457 *)&pCVar26->super_ContextOptions)[5].sa_handler;
    }
    else {
      name_01 = (ulong *)((_union_1457 *)&pCVar26->super_ContextOptions + 5);
    }
    pCVar25 = this->p;
    bVar9 = anon_unknown_14::matchesAny
                      ((char *)name_01,
                       (pCVar25->filters).
                       super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 8,false,
                       (pCVar25->super_ContextOptions).case_sensitive);
    if (bVar9) {
      local_328._0_8_ =
           (*((_union_1457 *)&pCVar26->super_ContextOptions)[8].sa_handler)(detail::g_cs);
      std::vector<doctest::IReporter*,std::allocator<doctest::IReporter*>>::
      emplace_back<doctest::IReporter*>
                ((vector<doctest::IReporter*,std::allocator<doctest::IReporter*>> *)
                 &pCVar25->reporters_currently_used,(IReporter **)local_328);
    }
    pCVar18 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar26);
    pCVar25 = pCVar26;
    pCVar26 = pCVar18;
  }
  anon_unknown_14::getListeners();
  pCVar26 = (ContextState *)
            anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left
  ;
  while (pCVar18 = this->p,
        pCVar26 !=
        (ContextState *)&anon_unknown_14::getListeners::data._M_t._M_impl.super__Rb_tree_header) {
    __position._M_current =
         (pCVar18->reporters_currently_used).
         super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_328._0_8_ = (*((_union_1457 *)&pCVar26->super_ContextOptions)[8].sa_handler)(detail::g_cs)
    ;
    std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::_M_insert_rval
              (&pCVar18->reporters_currently_used,__position,(value_type *)local_328);
    pCVar18 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar26);
    pCVar25 = pCVar26;
    pCVar26 = pCVar18;
  }
  if (((((pCVar18->super_ContextOptions).no_run != false) ||
       ((pCVar18->super_ContextOptions).version != false)) ||
      ((pCVar18->super_ContextOptions).help != false)) ||
     ((pCVar18->super_ContextOptions).list_reporters == true)) {
    ppIVar6 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar24 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar24 != ppIVar6;
        ppIVar24 = ppIVar24 + 1) {
      local_328._0_8_ = (TestCase *)0x0;
      local_328._8_8_ = (pointer)0x0;
      local_328._16_8_ = 0;
      (**(*ppIVar24)->_vptr_IReporter)(*ppIVar24,local_328);
    }
    iVar16 = run::anon_class_24_3_e7807fc8::operator()(&cleanup_and_return);
    goto LAB_00108955;
  }
  testArray.
  super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  testArray.
  super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  testArray.
  super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  detail::getRegisteredTests();
  pCVar26 = (ContextState *)
            detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (ppTVar8 = testArray.
                   super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
        pCVar18 = (ContextState *)
                  testArray.
                  super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        pCVar26 !=
        (ContextState *)&detail::getRegisteredTests::data._M_t._M_impl.super__Rb_tree_header) {
    local_328._0_8_ = (_union_1457 *)&pCVar26->super_ContextOptions + 4;
    std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>::
    emplace_back<doctest::detail::TestCase_const*>
              ((vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>
                *)&testArray,(TestCase **)local_328);
    pCVar18 = (ContextState *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar26);
    pCVar25 = pCVar26;
    pCVar26 = pCVar18;
  }
  pCVar26 = this->p;
  *(int *)&(pCVar26->super_ContextOptions).field_0x8c =
       (int)((ulong)((long)testArray.
                           super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)testArray.
                          super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (testArray.
      super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      testArray.
      super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pCVar25 = (ContextState *)&(pCVar26->super_ContextOptions).order_by;
    iVar16 = String::compare((String *)pCVar25,"file",true);
    if (iVar16 == 0) {
      __comp = anon_unknown_14::fileOrderComparator;
    }
    else {
      iVar16 = String::compare((String *)pCVar25,"suite",true);
      if (iVar16 == 0) {
        __comp = anon_unknown_14::suiteOrderComparator;
      }
      else {
        iVar16 = String::compare((String *)pCVar25,"name",true);
        if (iVar16 != 0) {
          iVar16 = String::compare((String *)pCVar25,"rand",true);
          if (iVar16 == 0) {
            uVar22 = (pCVar26->super_ContextOptions).rand_seed;
            pCVar25 = (ContextState *)(ulong)uVar22;
            srand(uVar22);
            ppTVar8 = testArray.
                      super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            for (uVar28 = (long)testArray.
                                super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)testArray.
                                super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3; uVar28 != 1;
                uVar28 = uVar28 - 1) {
              iVar16 = rand();
              pTVar7 = ppTVar8[uVar28 - 1];
              iVar16 = (int)((ulong)(long)iVar16 % uVar28);
              ppTVar8[uVar28 - 1] = ppTVar8[iVar16];
              ppTVar8[iVar16] = pTVar7;
            }
          }
          goto LAB_00108abc;
        }
        __comp = anon_unknown_14::nameOrderComparator;
      }
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<doctest::detail::TestCase_const**,std::vector<doctest::detail::TestCase_const*,std::allocator<doctest::detail::TestCase_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(doctest::detail::TestCase_const*,doctest::detail::TestCase_const*)>>
              ((__normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                )pCVar18,
               (__normal_iterator<const_doctest::detail::TestCase_**,_std::vector<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>_>
                )ppTVar8,
               (_Iter_comp_iter<bool_(*)(const_doctest::detail::TestCase_*,_const_doctest::detail::TestCase_*)>
                )__comp);
    pCVar25 = pCVar18;
  }
LAB_00108abc:
  testSuitesPassingFilt._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &testSuitesPassingFilt._M_t._M_impl.super__Rb_tree_header._M_header;
  testSuitesPassingFilt._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  testSuitesPassingFilt._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  testSuitesPassingFilt._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar26 = this->p;
  ppTVar27 = testArray.
             super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  testSuitesPassingFilt._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       testSuitesPassingFilt._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ppTVar8 = testArray.
            super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (((pCVar26->super_ContextOptions).count == false) &&
     ((pCVar26->super_ContextOptions).list_test_cases != true)) {
    queryResults.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    queryResults.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queryResults.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    bVar9 = true;
    if ((pCVar26->super_ContextOptions).list_test_suites == false) {
      ppIVar6 = (detail::g_cs->reporters_currently_used).
                super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppIVar24 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppIVar24 != ppIVar6;
          ppIVar24 = ppIVar24 + 1) {
        pCVar25 = (ContextState *)*ppIVar24;
        (**(code **)(((_union_1457 *)&pCVar25->super_ContextOptions)->sa_handler + 8))();
      }
      bVar9 = false;
      ppTVar27 = testArray.
                 super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppTVar8 = testArray.
                super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  else {
    queryResults.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    queryResults.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    queryResults.
    super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar9 = true;
  }
  for (; ppTVar27 != ppTVar8; ppTVar27 = ppTVar27 + 1) {
    pTVar7 = *ppTVar27;
    pCVar25 = this->p;
    if ((pTVar7->super_TestCaseData).m_skip == true) {
      bVar21 = *(undefined1 *)((long)&pCVar25->super_ContextOptions + 0x7f) ^ 1;
    }
    else {
      bVar21 = 0;
    }
    name_02 = pTVar7;
    if ((pTVar7->super_TestCaseData).m_file.field_0.buf[0x17] < '\0') {
      name_02 = (TestCase *)(pTVar7->super_TestCaseData).m_file.field_0.data.ptr;
    }
    filters = (pCVar25->filters).
              super__Vector_base<std::vector<doctest::String,_std::allocator<doctest::String>_>,_std::allocator<std::vector<doctest::String,_std::allocator<doctest::String>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    bVar15 = *(bool *)((long)&pCVar25->super_ContextOptions + 0x75);
    bVar10 = anon_unknown_14::matchesAny((char *)name_02,filters,true,bVar15);
    bVar11 = anon_unknown_14::matchesAny((char *)name_02,filters + 1,false,bVar15);
    name = (pTVar7->super_TestCaseData).m_test_suite;
    bVar12 = anon_unknown_14::matchesAny(name,filters + 2,true,bVar15);
    bVar13 = anon_unknown_14::matchesAny(name,filters + 3,false,bVar15);
    name_00 = (pTVar7->super_TestCaseData).m_name;
    bVar14 = anon_unknown_14::matchesAny(name_00,filters + 4,true,bVar15);
    bVar15 = anon_unknown_14::matchesAny(name_00,filters + 5,false,bVar15);
    uVar22 = *(uint *)&pCVar25->field_0x90;
    if ((!bVar15 && (bVar21 & 1) == 0) && ((bVar14 && (!bVar13 && !bVar11)) && (bVar12 && bVar10)))
    {
      uVar22 = uVar22 + 1;
      *(uint *)&pCVar25->field_0x90 = uVar22;
    }
    pCVar26 = (ContextState *)local_328;
    uVar3 = *(uint *)((long)&pCVar25->super_ContextOptions + 100);
    uVar4 = (uint)*(ulong *)((_union_1457 *)&pCVar25->super_ContextOptions + 0xd);
    if ((uVar3 <= uVar22 && (uVar4 < uVar3 || uVar22 <= uVar4)) &&
        ((!bVar15 && (bVar21 & 1) == 0) && ((bVar14 && (!bVar13 && !bVar11)) && (bVar12 && bVar10)))
       ) {
      if ((char)*(int *)((_union_1457 *)&pCVar25->super_ContextOptions + 0x11) == '\0') {
        if (*(undefined1 *)((long)&pCVar25->super_ContextOptions + 0x89) == '\x01') {
          pCVar25 = (ContextState *)&queryResults;
          local_328._0_8_ = pTVar7;
          std::vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>::
          emplace_back<doctest::TestCaseData_const*>
                    ((vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
                      *)pCVar25,(TestCaseData **)pCVar26);
        }
        else if (*(undefined1 *)((long)&pCVar25->super_ContextOptions + 0x8a) == '\x01') {
          String::String((String *)pCVar26,name);
          sVar19 = std::
                   set<doctest::String,_std::less<doctest::String>,_std::allocator<doctest::String>_>
                   ::count(&testSuitesPassingFilt,(key_type *)pCVar26);
          if (sVar19 == 0) {
            cVar2 = *(pTVar7->super_TestCaseData).m_test_suite;
            pCVar25 = pCVar26;
            String::~String((String *)pCVar26);
            if (cVar2 != '\0') {
              local_328._0_8_ = pTVar7;
              std::vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
              ::emplace_back<doctest::TestCaseData_const*>
                        ((vector<doctest::TestCaseData_const*,std::allocator<doctest::TestCaseData_const*>>
                          *)&queryResults,(TestCaseData **)pCVar26);
              String::String((String *)pCVar26,(pTVar7->super_TestCaseData).m_test_suite);
              std::
              _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
              ::_M_insert_unique<doctest::String>(&testSuitesPassingFilt._M_t,(String *)pCVar26);
              String::~String((String *)pCVar26);
              puVar30 = &this->p->field_0x94;
              *(int *)puVar30 = *(int *)puVar30 + 1;
              pCVar25 = pCVar26;
            }
          }
          else {
            String::~String((String *)pCVar26);
            pCVar25 = pCVar26;
          }
        }
        else {
          ((_union_1457 *)&pCVar25->super_ContextOptions)[5].sa_handler = (__sighandler_t)pTVar7;
          (pCVar25->super_CurrentTestCaseStats).failure_flags = 0;
          (pCVar25->super_CurrentTestCaseStats).seconds = 0.0;
          detail::MultiLaneAtomic<int>::operator=(&pCVar25->numAssertsFailedCurrentTest_atomic,0);
          detail::MultiLaneAtomic<int>::operator=(&this->p->numAssertsCurrentTest_atomic,0);
          std::
          _Rb_tree<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>,_std::_Identity<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::less<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>,_std::allocator<std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>_>_>
          ::clear(&(this->p->subcasesPassed)._M_t);
          ppIVar6 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (ppIVar24 = (detail::g_cs->reporters_currently_used).
                          super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppIVar24 != ppIVar6;
              ppIVar24 = ppIVar24 + 1) {
            (*(*ppIVar24)->_vptr_IReporter[3])(*ppIVar24,pTVar7);
          }
          pCVar25 = this->p;
          tVar20 = detail::getCurrentTicks();
          (pCVar25->timer).m_ticks = tVar20;
          pCVar25 = this->p;
          bVar15 = true;
          do {
            pCVar25->should_reenter = false;
            pCVar25->subcasesCurrentMaxLevel = 0;
            std::vector<doctest::SubcaseSignature,_std::allocator<doctest::SubcaseSignature>_>::
            clear(&pCVar25->subcasesStack);
            LOCK();
            (this->p->shouldLogCurrentException)._M_base._M_i = true;
            UNLOCK();
            std::vector<doctest::String,_std::allocator<doctest::String>_>::clear
                      (&this->p->stringifiedContexts);
            (anonymous_namespace)::FatalConditionHandler::isSet = 1;
            sigStack.ss_sp = (anonymous_namespace)::FatalConditionHandler::altStackMem;
            sigStack.ss_size = (size_t)(anonymous_namespace)::FatalConditionHandler::altStackSize;
            sigStack.ss_flags = 0;
            sigaltstack((sigaltstack *)&sigStack,
                        (sigaltstack *)(anonymous_namespace)::FatalConditionHandler::oldSigStack);
            memset(local_328 + 8,0,0x90);
            local_328._0_8_ = anon_unknown_14::FatalConditionHandler::handleSignal;
            local_2a0[0] = '\0';
            local_2a0[1] = '\0';
            local_2a0[2] = '\0';
            local_2a0[3] = '\b';
            puVar30 = (anonymous_namespace)::FatalConditionHandler::oldSigActions;
            for (lVar23 = 0; lVar23 != 0x60; lVar23 = lVar23 + 0x10) {
              sigaction(*(int *)((long)&(anonymous_namespace)::signalDefs + lVar23),
                        (sigaction *)pCVar26,(sigaction *)puVar30);
              puVar30 = (undefined1 *)((long)puVar30 + 0x98);
            }
            (*pTVar7->m_test)();
            anon_unknown_14::FatalConditionHandler::reset();
            anon_unknown_14::FatalConditionHandler::reset();
            pCVar25 = this->p;
            if (0 < (pCVar25->super_ContextOptions).abort_after) {
              iVar16 = *(int *)&pCVar25->field_0xa0;
              iVar17 = detail::MultiLaneAtomic::operator_cast_to_int
                                 (&pCVar25->numAssertsFailedCurrentTest_atomic);
              pCVar25 = this->p;
              if ((pCVar25->super_ContextOptions).abort_after <= iVar17 + iVar16) {
                piVar1 = &(pCVar25->super_CurrentTestCaseStats).failure_flags;
                *(byte *)piVar1 = (byte)*piVar1 | 8;
                bVar15 = false;
              }
            }
            if (pCVar25->should_reenter != true) break;
            if (bVar15) {
              ppIVar6 = (detail::g_cs->reporters_currently_used).
                        super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (ppIVar24 = (detail::g_cs->reporters_currently_used).
                              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                              ._M_impl.super__Vector_impl_data._M_start; ppIVar24 != ppIVar6;
                  ppIVar24 = ppIVar24 + 1) {
                (*(*ppIVar24)->_vptr_IReporter[4])(*ppIVar24,pTVar7);
              }
              pCVar25 = this->p;
              if ((pCVar25->should_reenter & 1U) == 0) break;
            }
          } while (bVar15);
          detail::ContextState::finalizeTestCaseData(pCVar25);
          ppIVar6 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          for (ppIVar24 = (detail::g_cs->reporters_currently_used).
                          super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                          ._M_impl.super__Vector_impl_data._M_start; ppIVar24 != ppIVar6;
              ppIVar24 = ppIVar24 + 1) {
            pCVar25 = (ContextState *)*ppIVar24;
            (**(code **)(((_union_1457 *)&pCVar25->super_ContextOptions)->sa_handler + 0x28))
                      (pCVar25,&detail::g_cs->super_CurrentTestCaseStats);
          }
          pCVar26 = this->p;
          (pCVar26->super_ContextOptions).currentTest = (TestCase *)0x0;
          iVar16 = (pCVar26->super_ContextOptions).abort_after;
          if ((0 < iVar16) && (iVar16 <= *(int *)&pCVar26->field_0xa0)) break;
        }
      }
    }
    else if (!bVar9) {
      ppIVar6 = (detail::g_cs->reporters_currently_used).
                super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppIVar24 = (detail::g_cs->reporters_currently_used).
                      super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppIVar24 != ppIVar6;
          ppIVar24 = ppIVar24 + 1) {
        pCVar25 = (ContextState *)*ppIVar24;
        (**(code **)(((_union_1457 *)&pCVar25->super_ContextOptions)->sa_handler + 0x58))
                  (pCVar25,pTVar7);
      }
    }
  }
  if (bVar9) {
    local_328._0_8_ = &(detail::g_cs->super_ContextOptions).field_0x8c;
    if (detail::g_cs == (ContextState *)0x0) {
      local_328._0_8_ = (TestCase *)0x0;
    }
    local_328._8_8_ =
         queryResults.
         super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_328._16_4_ =
         (int)((ulong)((long)queryResults.
                             super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)queryResults.
                            super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3);
    ppIVar6 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar24 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar24 != ppIVar6;
        ppIVar24 = ppIVar24 + 1) {
      pCVar25 = (ContextState *)*ppIVar24;
      (**(code **)((_union_1457 *)&pCVar25->super_ContextOptions)->sa_handler)(pCVar25,local_328);
    }
  }
  else {
    ppIVar6 = (detail::g_cs->reporters_currently_used).
              super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (ppIVar24 = (detail::g_cs->reporters_currently_used).
                    super__Vector_base<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppIVar24 != ppIVar6;
        ppIVar24 = ppIVar24 + 1) {
      pCVar25 = (ContextState *)*ppIVar24;
      (**(code **)(((_union_1457 *)&pCVar25->super_ContextOptions)->sa_handler + 0x10))
                (pCVar25,&(detail::g_cs->super_ContextOptions).field_0x8c);
    }
  }
  run::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)pCVar25);
  iVar16 = run::anon_class_24_3_e7807fc8::operator()(&cleanup_and_return);
  std::_Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>::
  ~_Vector_base(&queryResults.
                 super__Vector_base<const_doctest::TestCaseData_*,_std::allocator<const_doctest::TestCaseData_*>_>
               );
  std::
  _Rb_tree<doctest::String,_doctest::String,_std::_Identity<doctest::String>,_std::less<doctest::String>,_std::allocator<doctest::String>_>
  ::~_Rb_tree(&testSuitesPassingFilt._M_t);
  std::
  _Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
  ::~_Vector_base(&testArray.
                   super__Vector_base<const_doctest::detail::TestCase_*,_std::allocator<const_doctest::detail::TestCase_*>_>
                 );
LAB_00108955:
  std::fstream::~fstream(&fstr);
  return iVar16;
}

Assistant:

int Context::run() {
    using namespace detail;

    // save the old context state in case such was setup - for using asserts out of a testing context
    auto old_cs = g_cs;
    // this is the current contest
    g_cs               = p;
    is_running_in_test = true;

    g_no_colors = p->no_colors;
    p->resetRunData();

    // stdout by default
    p->cout = &std::cout;
    p->cerr = &std::cerr;

    // or to a file if specified
    std::fstream fstr;
    if(p->out.size()) {
        fstr.open(p->out.c_str(), std::fstream::out);
        p->cout = &fstr;
    }

    FatalConditionHandler::allocateAltStackMem();

    auto cleanup_and_return = [&]() {
        FatalConditionHandler::freeAltStackMem();

        if(fstr.is_open())
            fstr.close();

        // restore context
        g_cs               = old_cs;
        is_running_in_test = false;

        // we have to free the reporters which were allocated when the run started
        for(auto& curr : p->reporters_currently_used)
            delete curr;
        p->reporters_currently_used.clear();

        if(p->numTestCasesFailed && !p->no_exitcode)
            return EXIT_FAILURE;
        return EXIT_SUCCESS;
    };

    // setup default reporter if none is given through the command line
    if(p->filters[8].empty())
        p->filters[8].push_back("console");

    // check to see if any of the registered reporters has been selected
    for(auto& curr : getReporters()) {
        if(matchesAny(curr.first.second.c_str(), p->filters[8], false, p->case_sensitive))
            p->reporters_currently_used.push_back(curr.second(*g_cs));
    }

    // TODO: check if there is nothing in reporters_currently_used

    // prepend all listeners
    for(auto& curr : getListeners())
        p->reporters_currently_used.insert(p->reporters_currently_used.begin(), curr.second(*g_cs));

#ifdef DOCTEST_PLATFORM_WINDOWS
    if(isDebuggerActive() && p->no_debug_output == false)
        p->reporters_currently_used.push_back(new DebugOutputWindowReporter(*g_cs));
#endif // DOCTEST_PLATFORM_WINDOWS

    // handle version, help and no_run
    if(p->no_run || p->version || p->help || p->list_reporters) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, QueryData());

        return cleanup_and_return();
    }

    std::vector<const TestCase*> testArray;
    for(auto& curr : getRegisteredTests())
        testArray.push_back(&curr);
    p->numTestCases = testArray.size();

    // sort the collected records
    if(!testArray.empty()) {
        if(p->order_by.compare("file", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), fileOrderComparator);
        } else if(p->order_by.compare("suite", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), suiteOrderComparator);
        } else if(p->order_by.compare("name", true) == 0) {
            std::sort(testArray.begin(), testArray.end(), nameOrderComparator);
        } else if(p->order_by.compare("rand", true) == 0) {
            std::srand(p->rand_seed);

            // random_shuffle implementation
            const auto first = &testArray[0];
            for(size_t i = testArray.size() - 1; i > 0; --i) {
                int idxToSwap = std::rand() % (i + 1); // NOLINT

                const auto temp = first[i];

                first[i]         = first[idxToSwap];
                first[idxToSwap] = temp;
            }
        } else if(p->order_by.compare("none", true) == 0) {
            // means no sorting - beneficial for death tests which call into the executable
            // with a specific test case in mind - we don't want to slow down the startup times
        }
    }

    std::set<String> testSuitesPassingFilt;

    bool                             query_mode = p->count || p->list_test_cases || p->list_test_suites;
    std::vector<const TestCaseData*> queryResults;

    if(!query_mode)
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_start, DOCTEST_EMPTY);

    // invoke the registered functions if they match the filter criteria (or just count them)
    for(auto& curr : testArray) {
        const auto& tc = *curr;

        bool skip_me = false;
        if(tc.m_skip && !p->no_skip)
            skip_me = true;

        if(!matchesAny(tc.m_file.c_str(), p->filters[0], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_file.c_str(), p->filters[1], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_test_suite, p->filters[2], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_test_suite, p->filters[3], false, p->case_sensitive))
            skip_me = true;
        if(!matchesAny(tc.m_name, p->filters[4], true, p->case_sensitive))
            skip_me = true;
        if(matchesAny(tc.m_name, p->filters[5], false, p->case_sensitive))
            skip_me = true;

        if(!skip_me)
            p->numTestCasesPassingFilters++;

        // skip the test if it is not in the execution range
        if((p->last < p->numTestCasesPassingFilters && p->first <= p->last) ||
           (p->first > p->numTestCasesPassingFilters))
            skip_me = true;

        if(skip_me) {
            if(!query_mode)
                DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_skipped, tc);
            continue;
        }

        // do not execute the test if we are to only count the number of filter passing tests
        if(p->count)
            continue;

        // print the name of the test and don't execute it
        if(p->list_test_cases) {
            queryResults.push_back(&tc);
            continue;
        }

        // print the name of the test suite if not done already and don't execute it
        if(p->list_test_suites) {
            if((testSuitesPassingFilt.count(tc.m_test_suite) == 0) && tc.m_test_suite[0] != '\0') {
                queryResults.push_back(&tc);
                testSuitesPassingFilt.insert(tc.m_test_suite);
                p->numTestSuitesPassingFilters++;
            }
            continue;
        }

        // execute the test if it passes all the filtering
        {
            p->currentTest = &tc;

            p->failure_flags = TestCaseFailureReason::None;
            p->seconds       = 0;

            // reset atomic counters
            p->numAssertsFailedCurrentTest_atomic = 0;
            p->numAssertsCurrentTest_atomic       = 0;

            p->subcasesPassed.clear();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_start, tc);

            p->timer.start();
            
            bool run_test = true;

            do {
                // reset some of the fields for subcases (except for the set of fully passed ones)
                p->should_reenter          = false;
                p->subcasesCurrentMaxLevel = 0;
                p->subcasesStack.clear();

                p->shouldLogCurrentException = true;

                // reset stuff for logging with INFO()
                p->stringifiedContexts.clear();

#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                try {
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS
// MSVC 2015 diagnoses fatalConditionHandler as unused (because reset() is a static method)
DOCTEST_MSVC_SUPPRESS_WARNING_WITH_PUSH(4101) // unreferenced local variable
                    FatalConditionHandler fatalConditionHandler; // Handle signals
                    // execute the test
                    tc.m_test();
                    fatalConditionHandler.reset();
DOCTEST_MSVC_SUPPRESS_WARNING_POP
#ifndef DOCTEST_CONFIG_NO_EXCEPTIONS
                } catch(const TestFailureException&) {
                    p->failure_flags |= TestCaseFailureReason::AssertFailure;
                } catch(...) {
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_exception,
                                                      {translateActiveException(), false});
                    p->failure_flags |= TestCaseFailureReason::Exception;
                }
#endif // DOCTEST_CONFIG_NO_EXCEPTIONS

                // exit this loop if enough assertions have failed - even if there are more subcases
                if(p->abort_after > 0 &&
                   p->numAssertsFailed + p->numAssertsFailedCurrentTest_atomic >= p->abort_after) {
                    run_test = false;
                    p->failure_flags |= TestCaseFailureReason::TooManyFailedAsserts;
                }
                
                if(p->should_reenter && run_test)
                    DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_reenter, tc);
                if(!p->should_reenter)
                    run_test = false;
            } while(run_test);

            p->finalizeTestCaseData();

            DOCTEST_ITERATE_THROUGH_REPORTERS(test_case_end, *g_cs);

            p->currentTest = nullptr;

            // stop executing tests if enough assertions have failed
            if(p->abort_after > 0 && p->numAssertsFailed >= p->abort_after)
                break;
        }
    }

    if(!query_mode) {
        DOCTEST_ITERATE_THROUGH_REPORTERS(test_run_end, *g_cs);
    } else {
        QueryData qdata;
        qdata.run_stats = g_cs;
        qdata.data      = queryResults.data();
        qdata.num_data  = unsigned(queryResults.size());
        DOCTEST_ITERATE_THROUGH_REPORTERS(report_query, qdata);
    }

    // see these issues on the reasoning for this:
    // - https://github.com/onqtam/doctest/issues/143#issuecomment-414418903
    // - https://github.com/onqtam/doctest/issues/126
    auto DOCTEST_FIX_FOR_MACOS_LIBCPP_IOSFWD_STRING_LINK_ERRORS = []() DOCTEST_NOINLINE
        { std::cout << std::string(); };
    DOCTEST_FIX_FOR_MACOS_LIBCPP_IOSFWD_STRING_LINK_ERRORS();

    return cleanup_and_return();
}